

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

Frame * rw::findUnattachedById(HAnimHierarchy *hier,Frame *f,int32 id)

{
  int iVar1;
  int32 iVar2;
  Frame *pFVar3;
  long lVar4;
  
  lVar4 = (long)hAnimOffset;
  while( true ) {
    if (f == (Frame *)0x0) {
      return (Frame *)0x0;
    }
    iVar1 = *(int *)(&(f->object).type + lVar4);
    if ((iVar1 == id && -1 < iVar1) && (iVar2 = HAnimHierarchy::getIndex(hier,f), iVar2 == -1))
    break;
    pFVar3 = findUnattachedById(hier,f->next,id);
    if (pFVar3 != (Frame *)0x0) {
      return pFVar3;
    }
    f = f->child;
  }
  return f;
}

Assistant:

static Frame*
findUnattachedById(HAnimHierarchy *hier, Frame *f, int32 id)
{
	if(f == nil) return nil;
	HAnimData *hanim = HAnimData::get(f);
	if(hanim->id >= 0 && hanim->id == id && hier->getIndex(f) == -1) return f;
	Frame *ff = findUnattachedById(hier, f->next, id);
	if(ff) return ff;
	return findUnattachedById(hier, f->child, id);
}